

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * __thiscall
cmFileAPI::BuildClientReplyResponses
          (Value *__return_storage_ptr__,cmFileAPI *this,ClientRequests *requests)

{
  ClientRequests *this_00;
  bool bVar1;
  ulong uVar2;
  Value local_d0;
  reference local_a8;
  ClientRequest *request;
  const_iterator __end1;
  const_iterator __begin1;
  ClientRequests *__range1;
  Value local_50;
  undefined1 local_21;
  ClientRequests *local_20;
  ClientRequests *requests_local;
  cmFileAPI *this_local;
  Value *responses;
  
  local_21 = 0;
  local_20 = requests;
  requests_local = (ClientRequests *)this;
  this_local = (cmFileAPI *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,nullValue);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    BuildReplyError(&local_50,&local_20->Error);
    Json::Value::operator=(__return_storage_ptr__,&local_50);
    Json::Value::~Value(&local_50);
  }
  else {
    Json::Value::Value((Value *)&__range1,arrayValue);
    Json::Value::operator=(__return_storage_ptr__,(Value *)&__range1);
    Json::Value::~Value((Value *)&__range1);
    this_00 = local_20;
    __end1 = std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>::begin
                       (&local_20->
                         super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>
                       );
    request = (ClientRequest *)
              std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>::end
                        (&this_00->
                          super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>
                        );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmFileAPI::ClientRequest_*,_std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>_>
                                       *)&request), bVar1) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<const_cmFileAPI::ClientRequest_*,_std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>_>
                 ::operator*(&__end1);
      BuildClientReplyResponse(&local_d0,this,local_a8);
      Json::Value::append(__return_storage_ptr__,&local_d0);
      Json::Value::~Value(&local_d0);
      __gnu_cxx::
      __normal_iterator<const_cmFileAPI::ClientRequest_*,_std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>_>
      ::operator++(&__end1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildClientReplyResponses(
  ClientRequests const& requests)
{
  Json::Value responses;

  if (!requests.Error.empty()) {
    responses = this->BuildReplyError(requests.Error);
    return responses;
  }

  responses = Json::arrayValue;
  for (ClientRequest const& request : requests) {
    responses.append(this->BuildClientReplyResponse(request));
  }

  return responses;
}